

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O0

char * __thiscall TCLAP::ArgException::what(ArgException *this)

{
  int iVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  ArgException *local_10;
  ArgException *this_local;
  
  local_10 = this;
  if (what()::ex_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&what()::ex_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&what()::ex_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,&what()::ex_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&what()::ex_abi_cxx11_);
    }
  }
  std::operator+(&local_50,&this->_argId," -- ");
  std::operator+(&local_30,&local_50,&this->_errorText);
  std::__cxx11::string::operator=((string *)&what()::ex_abi_cxx11_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

const char* what() const throw() 
		{
			static std::string ex; 
			ex = _argId + " -- " + _errorText;
			return ex.c_str();
		}